

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1285::run(TestCase1285 *this)

{
  ulong uVar1;
  uint i;
  long lVar2;
  ListElementCount local_198 [2];
  DebugComparison<int,_unsigned_int> _kjCondition;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&reader,&message.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownUInt32List(&orphan,(Builder *)&reader);
  OrphanGetImpl<unsigned_int,_(capnp::Kind)0>::truncateListOf(&orphan.builder,3);
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
            (&reader,&orphan.builder);
  _kjCondition.left = 3;
  _kjCondition.right = reader.reader.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.reader.elementCount == 3;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_198[1] = 3;
    local_198[0] = reader.reader.elementCount;
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x50c,ERROR,
               "\"failed: expected \" \"(3) == (reader.size())\", _kjCondition, 3, reader.size()",
               (char (*) [40])"failed: expected (3) == (reader.size())",&_kjCondition,
               (int *)(local_198 + 1),local_198);
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    uVar1 = (ulong)reader.reader.step * lVar2 >> 3;
    _kjCondition.right = *(uint *)(reader.reader.ptr + uVar1);
    _kjCondition.left = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.right == 0;
    if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
      local_198[1] = 0;
      local_198[0] = *(ListElementCount *)(reader.reader.ptr + uVar1);
      kj::_::Debug::
      log<char_const(&)[36],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x50f,ERROR,
                 "\"failed: expected \" \"(0) == (reader[i])\", _kjCondition, 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",&_kjCondition,
                 (int *)(local_198 + 1),local_198);
    }
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendPointerListFromEmpty) {
  MallocMessageBuilder message;

  auto orphan = message.initRoot<TestAllTypes>().disownUInt32List();
  orphan.truncate(3);

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(0, reader[i]);
  }
}